

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O2

PDFImageXObject *
CreateImageXObjectForData
          (png_structp png_ptr,png_infop info_ptr,png_bytep row,ObjectsContext *inObjectsContext)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  png_uint_32 pVar5;
  png_uint_32 pVar6;
  EStatusCode EVar7;
  __jmp_buf_tag *__env;
  IndirectObjectsReferenceRegistry *pIVar8;
  ObjectIDType inObjectID;
  ObjectIDType inObjectReference;
  Trace *pTVar9;
  DictionaryContext *pDVar10;
  PDFStream *this;
  IByteWriter *pIVar11;
  PDFStream *pPVar12;
  byte bVar13;
  ulong inValue;
  ulong inValue_00;
  string *psVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  OutputStreamTraits traits;
  OutputStringBufferStream alphaWriteStream;
  PDFImageXObjectList listOfImages;
  MyStringBuf alphaComponentsData;
  
  listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&listOfImages;
  listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>._M_impl.
  _M_node._M_size = 0;
  listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 == 0) {
    pVar5 = png_get_image_width(png_ptr,info_ptr);
    pVar6 = png_get_image_height(png_ptr,info_ptr);
    bVar1 = png_get_color_type(png_ptr,info_ptr);
    bVar2 = png_get_bit_depth(png_ptr,info_ptr);
    bVar3 = png_get_channels(png_ptr,info_ptr);
    pIVar8 = ObjectsContext::GetInDirectObjectsRegistry(inObjectsContext);
    inObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar8);
    if ((bVar1 & 4) == 0) {
      inObjectReference = 0;
    }
    else {
      pIVar8 = ObjectsContext::GetInDirectObjectsRegistry(inObjectsContext);
      inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar8);
    }
    MyStringBuf::MyStringBuf(&alphaComponentsData);
    EVar7 = ObjectsContext::StartNewIndirectObject(inObjectsContext,inObjectID);
    if (EVar7 == eSuccess) {
      pDVar10 = ObjectsContext::StartDictionary(inObjectsContext);
      DictionaryContext::WriteKey(pDVar10,&scType_abi_cxx11_);
      DictionaryContext::WriteNameValue(pDVar10,&scXObject_abi_cxx11_);
      DictionaryContext::WriteKey(pDVar10,&scSubType_abi_cxx11_);
      DictionaryContext::WriteNameValue(pDVar10,&scImage_abi_cxx11_);
      DictionaryContext::WriteKey(pDVar10,&scWidth_abi_cxx11_);
      inValue = (ulong)pVar5;
      DictionaryContext::WriteIntegerValue(pDVar10,inValue);
      DictionaryContext::WriteKey(pDVar10,&scHeight_abi_cxx11_);
      inValue_00 = (ulong)pVar6;
      DictionaryContext::WriteIntegerValue(pDVar10,inValue_00);
      DictionaryContext::WriteKey(pDVar10,&scBitsPerComponent_abi_cxx11_);
      DictionaryContext::WriteIntegerValue(pDVar10,(ulong)bVar2);
      DictionaryContext::WriteKey(pDVar10,&scColorSpace_abi_cxx11_);
      bVar13 = bVar3 - ((bVar1 & 4) >> 2);
      psVar14 = &scDeviceRGB_abi_cxx11_;
      if (bVar13 == 1) {
        psVar14 = &scDeviceGray_abi_cxx11_;
      }
      DictionaryContext::WriteNameValue(pDVar10,psVar14);
      if ((bVar1 & 4) != 0) {
        DictionaryContext::WriteKey(pDVar10,&scSMask_abi_cxx11_);
        DictionaryContext::WriteNewObjectReferenceValue(pDVar10,inObjectReference);
      }
      this = ObjectsContext::StartPDFStream(inObjectsContext,pDVar10,false);
      pIVar11 = PDFStream::GetWriteStream(this);
      if ((bVar1 & 4) == 0) {
        iVar4 = pVar6 + 1;
        while (iVar4 = iVar4 + -1, iVar4 != 0) {
          png_read_row(png_ptr,row,(png_bytep)0x0);
          (*pIVar11->_vptr_IByteWriter[2])(pIVar11,row,(ulong)(pVar5 * bVar13));
        }
      }
      else {
        OutputStringBufferStream::OutputStringBufferStream(&alphaWriteStream,&alphaComponentsData);
        while (bVar17 = pVar6 != 0, pVar6 = pVar6 - 1, bVar17) {
          png_read_row(png_ptr,(png_bytep)0x0,row);
          uVar16 = 0;
          uVar15 = inValue;
          while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
            (*pIVar11->_vptr_IByteWriter[2])(pIVar11,row + (uVar16 & 0xffffffff),(ulong)bVar13);
            OutputStringBufferStream::Write
                      (&alphaWriteStream,row + (uVar16 & 0xffffffff) + bVar13,1);
            uVar16 = uVar16 + bVar3;
          }
        }
        OutputStringBufferStream::~OutputStringBufferStream(&alphaWriteStream);
      }
      EVar7 = ObjectsContext::EndPDFStream(inObjectsContext,this);
      if (EVar7 == eSuccess) {
        if ((bVar1 & 4) != 0) {
          EVar7 = ObjectsContext::StartNewIndirectObject(inObjectsContext,inObjectReference);
          if (EVar7 != eSuccess) {
            pTVar9 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar9,
                              "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld"
                              ,inObjectReference);
            goto LAB_001ad4c2;
          }
          pDVar10 = ObjectsContext::StartDictionary(inObjectsContext);
          DictionaryContext::WriteKey(pDVar10,&scType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar10,&scXObject_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar10,&scSubType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar10,&scImage_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar10,&scWidth_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar10,inValue);
          DictionaryContext::WriteKey(pDVar10,&scHeight_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar10,inValue_00);
          DictionaryContext::WriteKey(pDVar10,&scBitsPerComponent_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar10,(ulong)bVar2);
          DictionaryContext::WriteKey(pDVar10,&scColorSpace_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar10,&scDeviceGray_abi_cxx11_);
          pPVar12 = ObjectsContext::StartPDFStream(inObjectsContext,pDVar10,false);
          pIVar11 = PDFStream::GetWriteStream(pPVar12);
          InputStringBufferStream::InputStringBufferStream
                    ((InputStringBufferStream *)&alphaWriteStream,&alphaComponentsData);
          OutputStreamTraits::OutputStreamTraits(&traits,pIVar11);
          OutputStreamTraits::CopyToOutputStream(&traits,(IByteReader *)&alphaWriteStream);
          EVar7 = ObjectsContext::EndPDFStream(inObjectsContext,pPVar12);
          PDFStream::~PDFStream(pPVar12);
          operator_delete(pPVar12,0xf0);
          if (EVar7 != eSuccess) {
            pTVar9 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar9,
                              "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream"
                             );
            OutputStreamTraits::~OutputStreamTraits(&traits);
            InputStringBufferStream::~InputStringBufferStream
                      ((InputStringBufferStream *)&alphaWriteStream);
            pPVar12 = (PDFStream *)0x0;
            goto LAB_001ad6ba;
          }
          OutputStreamTraits::~OutputStreamTraits(&traits);
          InputStringBufferStream::~InputStringBufferStream
                    ((InputStringBufferStream *)&alphaWriteStream);
        }
        pPVar12 = (PDFStream *)operator_new(0x20);
        psVar14 = &KProcsetImageC_abi_cxx11_;
        if (bVar13 == 1) {
          psVar14 = &KProcsetImageB_abi_cxx11_;
        }
        EVar7 = eSuccess;
        PDFImageXObject::PDFImageXObject((PDFImageXObject *)pPVar12,inObjectID,psVar14);
      }
      else {
        pTVar9 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar9,
                          "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream"
                         );
LAB_001ad4c2:
        pPVar12 = (PDFStream *)0x0;
      }
    }
    else {
      pTVar9 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar9,
                        "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld"
                        ,inObjectID);
      pPVar12 = (PDFStream *)0x0;
      this = pPVar12;
    }
LAB_001ad6ba:
    std::__cxx11::stringbuf::~stringbuf((stringbuf *)&alphaComponentsData);
    if (EVar7 != eFailure) goto LAB_001ad6cc;
    if (pPVar12 == (PDFStream *)0x0) {
      pPVar12 = (PDFStream *)0x0;
    }
    else {
      PDFImageXObject::~PDFImageXObject((PDFImageXObject *)pPVar12);
    }
  }
  else {
    pPVar12 = (PDFStream *)0x0;
    this = pPVar12;
  }
  operator_delete(pPVar12,0x20);
  pPVar12 = (PDFStream *)0x0;
LAB_001ad6cc:
  if (this != (PDFStream *)0x0) {
    PDFStream::~PDFStream(this);
  }
  operator_delete(this,0xf0);
  std::__cxx11::_List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>::_M_clear
            (&listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>);
  return (PDFImageXObject *)pPVar12;
}

Assistant:

PDFImageXObject* CreateImageXObjectForData(png_structp png_ptr, png_infop info_ptr, png_bytep row, ObjectsContext* inObjectsContext) {
	PDFImageXObjectList listOfImages;
	PDFImageXObject* imageXObject = NULL;
	PDFStream* imageStream = NULL;
	EStatusCode status = eSuccess;

	do
	{

		if (setjmp(png_jmpbuf(png_ptr)))
		{
			// reset failure pointer
			status = eFailure;
			break;
		}

		// get info
		png_uint_32 transformed_width = png_get_image_width(png_ptr, info_ptr);
		png_uint_32 transformed_height = png_get_image_height(png_ptr, info_ptr);
		png_byte transformed_color_type = png_get_color_type(png_ptr, info_ptr);
		png_byte transformed_bit_depth = png_get_bit_depth(png_ptr, info_ptr);
		png_byte channels_count = png_get_channels(png_ptr, info_ptr);
		ObjectIDType imageXObjectObjectId = inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		// this image has only the color components, use to flag to determine what to ignore
		bool isAlpha = (transformed_color_type & PNG_COLOR_MASK_ALPHA) != 0;
		png_byte colorComponents = isAlpha ? (channels_count - 1) : channels_count;
		ObjectIDType imageMaskObjectId = isAlpha ? inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID():0;
		MyStringBuf alphaComponentsData;

		status = inObjectsContext->StartNewIndirectObject(imageXObjectObjectId);
		if(status != eSuccess)
		{
			TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld", imageXObjectObjectId);
			break;
		}
		DictionaryContext* imageContext = inObjectsContext->StartDictionary();

		// type
		imageContext->WriteKey(scType);
		imageContext->WriteNameValue(scXObject);

		// subtype
		imageContext->WriteKey(scSubType);
		imageContext->WriteNameValue(scImage);

		// Width
		imageContext->WriteKey(scWidth);
		imageContext->WriteIntegerValue(transformed_width);

		// Height
		imageContext->WriteKey(scHeight);
		imageContext->WriteIntegerValue(transformed_height);

		// Bits Per Component
		imageContext->WriteKey(scBitsPerComponent);
		imageContext->WriteIntegerValue(transformed_bit_depth);

		// Color Space
		imageContext->WriteKey(scColorSpace);
		imageContext->WriteNameValue(1 == colorComponents ? scDeviceGray : scDeviceRGB);

		// Mask in case of Alpha
		if (isAlpha) {
			imageContext->WriteKey(scSMask);
			imageContext->WriteNewObjectReferenceValue(imageMaskObjectId);
		}

		// now for the image
		imageStream = inObjectsContext->StartPDFStream(imageContext);
		IByteWriter* writerStream = imageStream->GetWriteStream();
		
		png_uint_32 y = transformed_height;

		if (isAlpha) {
			OutputStringBufferStream alphaWriteStream(&alphaComponentsData);

			while (y-- > 0) {
				// read (using "rectangle" method)
				png_read_row(png_ptr, NULL, row);
				// write. iterate per sample, splitting color components and alpha
				for (png_uint_32 i = 0; i < transformed_width; ++i) {
					
					// note that we're writing by color components, but multiply by channel...that's casue we're skipping alpha
					writerStream->Write((IOBasicTypes::Byte*)(row + i*channels_count), colorComponents);
					
					// write out to alpha stream as well (hummfff i don't like this...but i like less to decode the png again....
					// alpha is the last byte, so offset by color components
					alphaWriteStream.Write((IOBasicTypes::Byte*)(row + i*channels_count + colorComponents), 1);
				}
			}
		}
		else {
			while (y-- > 0) {
				// read
				png_read_row(png_ptr, row, NULL);
				// write
				writerStream->Write((IOBasicTypes::Byte*)(row), transformed_width*colorComponents);
			}
		}

		status = inObjectsContext->EndPDFStream(imageStream);
		if(status != eSuccess)
		{
			TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream");
			break;
		}

		// if there's a soft mask, write it now
		if (isAlpha) {
			status = inObjectsContext->StartNewIndirectObject(imageMaskObjectId);
			if(status != eSuccess)
			{
				TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld", imageMaskObjectId);
				break;
			}
			DictionaryContext* imageMaskContext = inObjectsContext->StartDictionary();

			// type
			imageMaskContext->WriteKey(scType);
			imageMaskContext->WriteNameValue(scXObject);

			// subtype
			imageMaskContext->WriteKey(scSubType);
			imageMaskContext->WriteNameValue(scImage);

			// Width
			imageMaskContext->WriteKey(scWidth);
			imageMaskContext->WriteIntegerValue(transformed_width);

			// Height
			imageMaskContext->WriteKey(scHeight);
			imageMaskContext->WriteIntegerValue(transformed_height);

			// Bits Per Component
			imageMaskContext->WriteKey(scBitsPerComponent);
			imageMaskContext->WriteIntegerValue(transformed_bit_depth);

			// Color Space
			imageMaskContext->WriteKey(scColorSpace);
			imageMaskContext->WriteNameValue(scDeviceGray);

			PDFStream* imageMaskStream = inObjectsContext->StartPDFStream(imageMaskContext);
			IByteWriter* writerMaskStream = imageMaskStream->GetWriteStream();

			// write the alpha samples
			InputStringBufferStream alphaWriteStream(&alphaComponentsData);
			OutputStreamTraits traits(writerMaskStream);
			traits.CopyToOutputStream(&alphaWriteStream);

			status = inObjectsContext->EndPDFStream(imageMaskStream);
			delete imageMaskStream;
			if(status != eSuccess)
			{
				TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream");
				break;
			}
		}

		imageXObject = new PDFImageXObject(imageXObjectObjectId, 1 == colorComponents ? KProcsetImageB : KProcsetImageC);
	} while (false);

	if (eFailure == status) {
		delete imageXObject;
		imageXObject = NULL;
	}
	delete imageStream;
	return imageXObject;
}